

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O1

int MPIABI_Waitany(int count,MPIABI_Request *array_of_requests,int *indx,MPIABI_StatusPtr status)

{
  undefined8 uVar1;
  int iVar2;
  MPI_Status *mpi_status_ptr;
  
  iVar2 = MPI_Waitany();
  if (status != (MPIABI_StatusPtr)0x0) {
    status->MPI_SOURCE = (status->mpi_status).status_OpenMPI.f0;
    uVar1 = *(undefined8 *)((long)&status->mpi_status + 4);
    status->MPI_TAG = (int)uVar1;
    status->MPI_ERROR = (int)((ulong)uVar1 >> 0x20);
  }
  return iVar2;
}

Assistant:

int MPIABI_Waitany(int count, MPIABI_Request array_of_requests[],
                              int *indx, MPIABI_StatusPtr status) {
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  const int ierr = MPI_Waitany(count, reqs, indx, (WPI_StatusPtr)status);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  return ierr;
}